

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

void path_add(path_state_t *state,char *path)

{
  char *pcVar1;
  char *__dest;
  
  if (path == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = util_shortname(path);
  }
  if ((long)pcVar1 - (long)path == 0) {
    __dest = (char *)malloc(1);
    pcVar1 = __dest;
  }
  else {
    __dest = (char *)malloc((long)pcVar1 - (long)path);
    memcpy(__dest,path,(size_t)(pcVar1 + ~(ulong)path));
    pcVar1 = pcVar1 + ~(ulong)path + (long)__dest;
  }
  *pcVar1 = '\0';
  list_append_new(&state->path_list,__dest);
  return;
}

Assistant:

void
path_add(
    path_state_t* state,
    char* path)
{
    char* dir_path;
    const char* tmp = path ? util_shortname(path) : NULL; /* NULL check is needed for stdin */
    if (path != tmp) {
        size_t len = tmp-1 - path;
        dir_path = malloc(len + 1);
        memcpy(dir_path, path, len);
        dir_path[len] = '\0';
    } else {
        dir_path = malloc(1);
        dir_path[0] = '\0';
    }

    list_append_new(&state->path_list, (void*)dir_path);
}